

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedAggregateLocalSinkState::~PartitionedAggregateLocalSinkState
          (PartitionedAggregateLocalSinkState *this)

{
  ~PartitionedAggregateLocalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

PartitionedAggregateLocalSinkState(const PhysicalPartitionedAggregate &op, const vector<LogicalType> &child_types,
	                                   ExecutionContext &context)
	    : execute_state(context.client, op.aggregates, child_types) {
	}